

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string generator;
  string make;
  ostringstream ss;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = local_198 + 0x10;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_MAKE_PROGRAM","");
  pcVar3 = cmMakefile::GetRequiredDefinition(mf,(string *)local_198);
  std::__cxx11::string::string((string *)&local_1d8,pcVar3,(allocator *)local_1f8);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_GENERATOR","");
  pcVar3 = cmMakefile::GetSafeDefinition(mf,(string *)local_198);
  std::__cxx11::string::string((string *)local_1f8,pcVar3,(allocator *)local_1b8);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)local_1f8);
    if (iVar2 != 0) goto LAB_0030c37d;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," -f$(ProjectPath)/Makefile $(CurrentFileName).cpp.o",0x33);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
LAB_0030c37d:
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand
(const cmMakefile* mf) const
{
  std::string buildCommand;
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  if ( generator == "Unix Makefiles" || generator == "MinGW Makefiles" )
    {
    std::ostringstream ss;
    ss << make << " -f$(ProjectPath)/Makefile $(CurrentFileName).cpp.o";
    buildCommand = ss.str();
    }
  return buildCommand;
}